

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arena_test.cc
# Opt level: O3

void __thiscall
anon_unknown.dwarf_351f5::Environment::RandomPoke(Environment *this,BitGen *gen,size_t min_index)

{
  result_type rVar1;
  
  rVar1 = absl::lts_20250127::random_internal::
          DistributionCaller<absl::lts_20250127::random_internal::NonsecureURBGBase<absl::lts_20250127::random_internal::randen_engine<unsigned_long>,absl::lts_20250127::random_internal::RandenPoolSeedSeq>>
          ::Impl<absl::lts_20250127::random_internal::UniformDistributionWrapper<int>,int&,int&>
                    (gen);
  if (rVar1 == 1) {
    RandomFuse(this,gen);
  }
  else if (rVar1 == 0) {
    RandomNewFree(this,gen,min_index);
  }
  return;
}

Assistant:

void RandomPoke(absl::BitGen& gen, size_t min_index = 0) {
    switch (absl::Uniform(gen, 0, 2)) {
      case 0:
        RandomNewFree(gen, min_index);
        break;
      case 1:
        RandomFuse(gen);
        break;
      default:
        break;
    }
  }